

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O3

PinResult __thiscall
density::detail::
PinGuard<density_tests::UnmovableFastTestAllocator<256UL>,_(density::progress_guarantee)2>::pin
          (PinGuard<density_tests::UnmovableFastTestAllocator<256UL>,_(density::progress_guarantee)2>
           *this,void *i_address)

{
  atomic<unsigned_long> *paVar1;
  PinResult PVar2;
  uintptr_t uint_pointer;
  void *pvVar3;
  void *i_address_00;
  long in_FS_OFFSET;
  
  pvVar3 = (void *)((ulong)i_address & 0xffffffffffffff00);
  i_address_00 = this->m_pinned_page;
  if (i_address_00 == pvVar3) {
    PVar2 = AlreadyPinned;
  }
  else {
    if (pvVar3 != (void *)0x0) {
      LOCK();
      paVar1 = &this->m_allocator->m_living_pins;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance::__tls_init();
      if (*(long *)(in_FS_OFFSET + -0x30) != 0) {
        PageAllocator<density::detail::SystemPageManager<256UL>_>::process_pending_unpins_impl
                  (progress_lock_free);
      }
      LOCK();
      *(long *)((long)pvVar3 + 0xf8U) = *(long *)((long)pvVar3 + 0xf8U) + 1;
      UNLOCK();
      i_address_00 = this->m_pinned_page;
    }
    if (i_address_00 != (void *)0x0) {
      density_tests::UnmovableFastTestAllocator<256UL>::unpin_page(this->m_allocator,i_address_00);
    }
    this->m_pinned_page = pvVar3;
    PVar2 = PinSuccessfull;
  }
  return PVar2;
}

Assistant:

PinResult pin(void * i_address) noexcept
            {
                auto const page = address_lower_align(i_address, ALLOCATOR_TYPE::page_alignment);
                if (page == m_pinned_page)
                {
                    return AlreadyPinned;
                }
                if (ConstConditional(PROGRESS_GUARANTEE == progress_wait_free))
                {
                    if (page != nullptr)
                    {
                        if (!m_allocator->try_pin_page(progress_wait_free, page))
                            return PinFailed;
                    }
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(progress_wait_free, m_pinned_page);
                }
                else
                {
                    if (page != nullptr)
                        m_allocator->pin_page(page);
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(m_pinned_page);
                }
                m_pinned_page = page;
                return PinSuccessfull;
            }